

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O0

int bgzf_is_bgzf(char *fn)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  int iVar7;
  hFILE *fp_00;
  ssize_t sVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  byte bVar22;
  hFILE *fp;
  char cStack_28;
  char cStack_27;
  char cStack_26;
  char cStack_25;
  int n;
  uint8_t buf [16];
  char *fn_local;
  
  buf._8_8_ = fn;
  fp_00 = hopen(fn,"r");
  if (fp_00 == (hFILE *)0x0) {
    fn_local._4_4_ = 0;
  }
  else {
    sVar8 = hread(fp_00,&cStack_28,0x10);
    iVar7 = hclose(fp_00);
    if (iVar7 < 0) {
      fn_local._4_4_ = 0xffffffff;
    }
    else if ((int)sVar8 == 0x10) {
      cVar9 = -(cStack_26 == '\b');
      cVar10 = -(cStack_25 == '\x04');
      cVar11 = -((char)n == '\0');
      cVar12 = -(n._1_1_ == '\0');
      cVar13 = -(n._2_1_ == '\0');
      cVar14 = -(n._3_1_ == '\0');
      cVar15 = -(buf[0] == '\0');
      cVar16 = -(buf[1] == 0xff);
      cVar17 = -(buf[2] == '\x06');
      cVar18 = -(buf[3] == '\0');
      cVar19 = -(buf[4] == 'B');
      cVar20 = -(buf[5] == 'C');
      cVar21 = -(buf[6] == '\x02');
      bVar22 = -(buf[7] == '\0');
      auVar1[1] = -(cStack_27 == -0x75);
      auVar1[0] = -(cStack_28 == '\x1f');
      auVar1[2] = cVar9;
      auVar1[3] = cVar10;
      auVar1[4] = cVar11;
      auVar1[5] = cVar12;
      auVar1[6] = cVar13;
      auVar1[7] = cVar14;
      auVar1[8] = cVar15;
      auVar1[9] = cVar16;
      auVar1[10] = cVar17;
      auVar1[0xb] = cVar18;
      auVar1[0xc] = cVar19;
      auVar1[0xd] = cVar20;
      auVar1[0xe] = cVar21;
      auVar1[0xf] = bVar22;
      auVar2[1] = -(cStack_27 == -0x75);
      auVar2[0] = -(cStack_28 == '\x1f');
      auVar2[2] = cVar9;
      auVar2[3] = cVar10;
      auVar2[4] = cVar11;
      auVar2[5] = cVar12;
      auVar2[6] = cVar13;
      auVar2[7] = cVar14;
      auVar2[8] = cVar15;
      auVar2[9] = cVar16;
      auVar2[10] = cVar17;
      auVar2[0xb] = cVar18;
      auVar2[0xc] = cVar19;
      auVar2[0xd] = cVar20;
      auVar2[0xe] = cVar21;
      auVar2[0xf] = bVar22;
      auVar6[1] = cVar10;
      auVar6[0] = cVar9;
      auVar6[2] = cVar11;
      auVar6[3] = cVar12;
      auVar6[4] = cVar13;
      auVar6[5] = cVar14;
      auVar6[6] = cVar15;
      auVar6[7] = cVar16;
      auVar6[8] = cVar17;
      auVar6[9] = cVar18;
      auVar6[10] = cVar19;
      auVar6[0xb] = cVar20;
      auVar6[0xc] = cVar21;
      auVar6[0xd] = bVar22;
      auVar5[1] = cVar11;
      auVar5[0] = cVar10;
      auVar5[2] = cVar12;
      auVar5[3] = cVar13;
      auVar5[4] = cVar14;
      auVar5[5] = cVar15;
      auVar5[6] = cVar16;
      auVar5[7] = cVar17;
      auVar5[8] = cVar18;
      auVar5[9] = cVar19;
      auVar5[10] = cVar20;
      auVar5[0xb] = cVar21;
      auVar5[0xc] = bVar22;
      auVar4[1] = cVar12;
      auVar4[0] = cVar11;
      auVar4[2] = cVar13;
      auVar4[3] = cVar14;
      auVar4[4] = cVar15;
      auVar4[5] = cVar16;
      auVar4[6] = cVar17;
      auVar4[7] = cVar18;
      auVar4[8] = cVar19;
      auVar4[9] = cVar20;
      auVar4[10] = cVar21;
      auVar4[0xb] = bVar22;
      auVar3[1] = cVar13;
      auVar3[0] = cVar12;
      auVar3[2] = cVar14;
      auVar3[3] = cVar15;
      auVar3[4] = cVar16;
      auVar3[5] = cVar17;
      auVar3[6] = cVar18;
      auVar3[7] = cVar19;
      auVar3[8] = cVar20;
      auVar3[9] = cVar21;
      auVar3[10] = bVar22;
      fn_local._4_4_ =
           (uint)((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 |
                           (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3 |
                           (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                           (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                           (ushort)((byte)(CONCAT19(bVar22,CONCAT18(cVar21,CONCAT17(cVar20,CONCAT16(
                                                  cVar19,CONCAT15(cVar18,CONCAT14(cVar17,CONCAT13(
                                                  cVar16,CONCAT12(cVar15,CONCAT11(cVar14,cVar13)))))
                                                  )))) >> 7) & 1) << 6 |
                           (ushort)((byte)(CONCAT18(bVar22,CONCAT17(cVar21,CONCAT16(cVar20,CONCAT15(
                                                  cVar19,CONCAT14(cVar18,CONCAT13(cVar17,CONCAT12(
                                                  cVar16,CONCAT11(cVar15,cVar14)))))))) >> 7) & 1)
                           << 7 | (ushort)(bVar22 >> 7) << 0xf) == 0xffff);
    }
    else {
      fn_local._4_4_ = 0;
    }
  }
  return fn_local._4_4_;
}

Assistant:

int bgzf_is_bgzf(const char *fn)
{
    uint8_t buf[16];
    int n;
    hFILE *fp;
    if ((fp = hopen(fn, "r")) == 0) return 0;
    n = hread(fp, buf, 16);
    if ( hclose(fp) < 0 ) return -1;
    if (n != 16) return 0;
    return memcmp(g_magic, buf, 16) == 0? 1 : 0;
}